

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall MeCab::anon_unknown_0::LatticeImpl::~LatticeImpl(LatticeImpl *this)

{
  scoped_ptr<MeCab::Allocator<mecab_node_t,_mecab_path_t>_> *in_RDI;
  vector<const_char_*,_std::allocator<const_char_*>_> *unaff_retaddr;
  
  in_RDI->_vptr_scoped_ptr = (_func_int **)&PTR_clear_00247b10;
  scoped_ptr<MeCab::Allocator<mecab_node_t,_mecab_path_t>_>::~scoped_ptr(in_RDI);
  scoped_ptr<MeCab::StringBuffer>::~scoped_ptr((scoped_ptr<MeCab::StringBuffer> *)in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(unaff_retaddr);
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::~vector
            ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)unaff_retaddr);
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::~vector
            ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  Lattice::~Lattice((Lattice *)in_RDI);
  return;
}

Assistant:

void LatticeImpl::clear() {
  allocator_->free();
  if (ostrs_.get()) {
    ostrs_->clear();
  }
  begin_nodes_.clear();
  end_nodes_.clear();
  feature_constraint_.clear();
  boundary_constraint_.clear();
  size_ = 0;
  theta_ = kDefaultTheta;
  Z_ = 0.0;
  sentence_ = 0;
}